

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_analyze_tag_directive(yaml_emitter_t *emitter,yaml_tag_directive_t tag_directive)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  yaml_char_t *pyVar4;
  yaml_char_t *__s;
  yaml_char_t *__s_00;
  int local_74;
  int local_70;
  int local_6c;
  size_t prefix_length;
  size_t handle_length;
  yaml_string_t prefix;
  yaml_string_t handle;
  yaml_emitter_t *emitter_local;
  yaml_tag_directive_t tag_directive_local;
  
  __s = tag_directive.prefix;
  __s_00 = tag_directive.handle;
  sVar2 = strlen((char *)__s_00);
  sVar3 = strlen((char *)__s);
  pyVar4 = __s_00 + sVar2;
  if (__s_00 == pyVar4) {
    tag_directive_local.prefix._4_4_ =
         yaml_emitter_set_emitter_error(emitter,"tag handle must not be empty");
  }
  else if (*__s_00 == '!') {
    if (pyVar4[-1] == '!') {
      for (handle.end = __s_00 + 1; handle.end < pyVar4 + -1; handle.end = handle.end + local_6c) {
        if (((((*handle.end < 0x30) || (0x39 < *handle.end)) &&
             ((*handle.end < 0x41 || (0x5a < *handle.end)))) &&
            (((*handle.end < 0x61 || (0x7a < *handle.end)) && (*handle.end != '_')))) &&
           (*handle.end != '-')) {
          iVar1 = yaml_emitter_set_emitter_error
                            (emitter,"tag handle must contain alphanumerical characters only");
          return iVar1;
        }
        if ((*handle.end & 0x80) == 0) {
          local_6c = 1;
        }
        else {
          if ((*handle.end & 0xe0) == 0xc0) {
            local_70 = 2;
          }
          else {
            if ((*handle.end & 0xf0) == 0xe0) {
              local_74 = 3;
            }
            else {
              local_74 = 0;
              if ((*handle.end & 0xf8) == 0xf0) {
                local_74 = 4;
              }
            }
            local_70 = local_74;
          }
          local_6c = local_70;
        }
      }
      if (__s == __s + sVar3) {
        tag_directive_local.prefix._4_4_ =
             yaml_emitter_set_emitter_error(emitter,"tag prefix must not be empty");
      }
      else {
        tag_directive_local.prefix._4_4_ = 1;
      }
    }
    else {
      tag_directive_local.prefix._4_4_ =
           yaml_emitter_set_emitter_error(emitter,"tag handle must end with \'!\'");
    }
  }
  else {
    tag_directive_local.prefix._4_4_ =
         yaml_emitter_set_emitter_error(emitter,"tag handle must start with \'!\'");
  }
  return tag_directive_local.prefix._4_4_;
}

Assistant:

static int
yaml_emitter_analyze_tag_directive(yaml_emitter_t *emitter,
        yaml_tag_directive_t tag_directive)
{
    yaml_string_t handle;
    yaml_string_t prefix;
    size_t handle_length;
    size_t prefix_length;

    handle_length = strlen((char *)tag_directive.handle);
    prefix_length = strlen((char *)tag_directive.prefix);
    STRING_ASSIGN(handle, tag_directive.handle, handle_length);
    STRING_ASSIGN(prefix, tag_directive.prefix, prefix_length);

    if (handle.start == handle.end) {
        return yaml_emitter_set_emitter_error(emitter,
                "tag handle must not be empty");
    }

    if (handle.start[0] != '!') {
        return yaml_emitter_set_emitter_error(emitter,
                "tag handle must start with '!'");
    }

    if (handle.end[-1] != '!') {
        return yaml_emitter_set_emitter_error(emitter,
                "tag handle must end with '!'");
    }

    handle.pointer ++;

    while (handle.pointer < handle.end-1) {
        if (!IS_ALPHA(handle)) {
            return yaml_emitter_set_emitter_error(emitter,
                    "tag handle must contain alphanumerical characters only");
        }
        MOVE(handle);
    }

    if (prefix.start == prefix.end) {
        return yaml_emitter_set_emitter_error(emitter,
                "tag prefix must not be empty");
    }

    return 1;
}